

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

bool embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_16777232,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::QuadMiMBIntersectorKMoeller<4,_4,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  int *piVar7;
  float *pfVar8;
  int *piVar9;
  float *pfVar10;
  float *pfVar11;
  float *pfVar12;
  float *pfVar13;
  float *pfVar14;
  float *pfVar15;
  float *pfVar16;
  float *pfVar17;
  float *pfVar18;
  float *pfVar19;
  float *pfVar20;
  float *pfVar21;
  float *pfVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  Ref<embree::Geometry> *pRVar25;
  Geometry *pGVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  RTCFilterFunctionN p_Var34;
  bool bVar35;
  bool bVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  bool bVar42;
  undefined8 uVar43;
  undefined8 uVar44;
  uint uVar45;
  AABBNodeMB4D *node1;
  ulong uVar46;
  ulong uVar47;
  long lVar48;
  RTCRayN *pRVar49;
  ulong uVar50;
  ulong uVar51;
  size_t sVar52;
  undefined4 uVar53;
  NodeRef *pNVar54;
  Scene *pSVar55;
  ulong uVar56;
  ulong uVar57;
  long lVar58;
  ulong uVar59;
  int iVar60;
  ulong uVar61;
  ulong uVar62;
  ulong uVar63;
  long lVar64;
  ulong uVar65;
  bool bVar66;
  bool bVar67;
  float fVar68;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  float fVar72;
  uint uVar73;
  float fVar83;
  undefined1 auVar74 [12];
  float fVar82;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  float fVar84;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar85 [12];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  float fVar88;
  float fVar95;
  float fVar96;
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  float fVar97;
  undefined1 auVar94 [16];
  float fVar98;
  float fVar99;
  float fVar103;
  float fVar105;
  undefined1 auVar100 [16];
  float fVar104;
  float fVar106;
  float fVar107;
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  float fVar108;
  float fVar109;
  float fVar110;
  float fVar111;
  float fVar112;
  float fVar113;
  float fVar114;
  float fVar115;
  float fVar116;
  uint uVar117;
  float fVar118;
  uint uVar119;
  float fVar120;
  uint uVar121;
  float fVar122;
  uint uVar123;
  float fVar124;
  float fVar125;
  float fVar128;
  float fVar129;
  float fVar130;
  float fVar131;
  float fVar132;
  float fVar133;
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  float fVar134;
  float fVar135;
  float fVar136;
  float fVar137;
  float fVar138;
  float fVar139;
  float fVar140;
  float fVar141;
  float fVar142;
  float fVar143;
  int iVar144;
  float fVar145;
  int iVar146;
  float fVar147;
  int iVar148;
  float fVar149;
  int iVar150;
  float fVar151;
  int iVar152;
  float fVar153;
  int iVar154;
  float fVar155;
  int iVar156;
  float fVar157;
  float fVar158;
  float fVar159;
  float fVar160;
  float fVar161;
  float fVar162;
  float fVar163;
  float fVar166;
  float fVar167;
  float fVar168;
  float fVar169;
  float fVar170;
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  float fStack_bd0;
  float fStack_bcc;
  float local_ba8;
  float fStack_ba4;
  float fStack_ba0;
  float fStack_b9c;
  undefined1 local_b98 [16];
  undefined8 local_b88;
  float fStack_b80;
  float fStack_b7c;
  int local_b78;
  int iStack_b74;
  int iStack_b70;
  int iStack_b6c;
  int local_b68;
  int iStack_b64;
  int iStack_b60;
  int iStack_b5c;
  float local_b58;
  float fStack_b54;
  float fStack_b50;
  float fStack_b4c;
  float local_b48;
  float fStack_b44;
  float fStack_b40;
  float fStack_b3c;
  float local_b38;
  float fStack_b34;
  float fStack_b30;
  float fStack_b2c;
  float local_b28;
  float fStack_b24;
  float fStack_b20;
  float fStack_b1c;
  float local_b18;
  float fStack_b14;
  float fStack_b10;
  float fStack_b0c;
  float local_b08;
  float fStack_b04;
  float fStack_b00;
  float fStack_afc;
  float local_af8;
  float fStack_af4;
  float fStack_af0;
  float fStack_aec;
  float local_ae8;
  float fStack_ae4;
  float fStack_ae0;
  float fStack_adc;
  float local_ad8;
  float fStack_ad4;
  float fStack_ad0;
  float fStack_acc;
  int iStack_ac8;
  int iStack_ac4;
  undefined1 (*local_ac0) [16];
  ulong local_ab8;
  ulong local_ab0;
  ulong local_aa8;
  ulong local_aa0;
  ulong local_a98;
  ulong local_a90;
  NodeRef *local_a88;
  Scene *local_a80;
  RTCFilterFunctionNArguments args;
  float local_9f8;
  float fStack_9f4;
  undefined1 local_948 [16];
  undefined1 local_938 [16];
  undefined1 local_928 [8];
  float fStack_920;
  float fStack_91c;
  undefined1 local_918 [8];
  float fStack_910;
  float fStack_90c;
  undefined1 local_908 [16];
  undefined1 local_8f8 [8];
  float fStack_8f0;
  float fStack_8ec;
  undefined1 local_8e8 [16];
  RTCHitN local_8d8 [16];
  undefined4 local_8c8;
  undefined4 uStack_8c4;
  undefined4 uStack_8c0;
  undefined4 uStack_8bc;
  undefined4 local_8b8;
  undefined4 uStack_8b4;
  undefined4 uStack_8b0;
  undefined4 uStack_8ac;
  undefined4 local_8a8;
  undefined4 uStack_8a4;
  undefined4 uStack_8a0;
  undefined4 uStack_89c;
  undefined1 local_898 [16];
  undefined1 local_888 [16];
  uint local_878;
  uint uStack_874;
  uint uStack_870;
  uint uStack_86c;
  uint local_868;
  uint uStack_864;
  uint uStack_860;
  uint uStack_85c;
  uint local_858;
  uint uStack_854;
  uint uStack_850;
  uint uStack_84c;
  undefined1 local_848 [16];
  undefined1 local_838 [16];
  undefined1 local_828 [16];
  undefined8 local_818;
  undefined8 uStack_810;
  float local_808;
  float fStack_804;
  float fStack_800;
  float fStack_7fc;
  float local_7f8;
  float fStack_7f4;
  float fStack_7f0;
  float fStack_7ec;
  float local_7e8;
  float fStack_7e4;
  float fStack_7e0;
  float fStack_7dc;
  NodeRef stack [244];
  
  stack[0] = root;
  fVar68 = *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar99 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar104 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar106 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar124 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar128 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  uVar56 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar57 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar59 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar51 = uVar56 ^ 0x10;
  uVar61 = uVar57 ^ 0x10;
  uVar63 = uVar59 ^ 0x10;
  iVar60 = (tray->tnear).field_0.i[k];
  iVar150 = (tray->tfar).field_0.i[k];
  local_818 = mm_lookupmask_ps._0_8_;
  uStack_810 = mm_lookupmask_ps._8_8_;
  local_828 = mm_lookupmask_ps._240_16_;
  local_ac0 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  local_a88 = stack + 1;
  fVar130 = fVar68;
  fVar132 = fVar68;
  fVar72 = fVar68;
  fVar82 = fVar99;
  fVar83 = fVar99;
  fVar84 = fVar99;
  fVar88 = fVar104;
  fVar95 = fVar104;
  fVar96 = fVar104;
  fVar97 = fVar124;
  fVar98 = fVar124;
  fVar103 = fVar124;
  fVar105 = fVar128;
  fVar107 = fVar128;
  fVar109 = fVar128;
  iVar144 = iVar60;
  iVar146 = iVar60;
  iVar148 = iVar60;
  iVar152 = iVar150;
  iVar154 = iVar150;
  iVar156 = iVar150;
  fVar111 = fVar106;
  fVar113 = fVar106;
  fVar115 = fVar106;
  iStack_b70 = iVar150;
  iStack_b6c = iVar150;
  local_b68 = iVar60;
  iStack_b64 = iVar60;
  iStack_b60 = iVar60;
  iStack_b5c = iVar60;
  local_b58 = fVar128;
  fStack_b54 = fVar128;
  fStack_b50 = fVar128;
  fStack_b4c = fVar128;
  local_b48 = fVar124;
  fStack_b44 = fVar124;
  fStack_b40 = fVar124;
  fStack_b3c = fVar124;
  local_b38 = fVar106;
  fStack_b34 = fVar106;
  fStack_b30 = fVar106;
  fStack_b2c = fVar106;
  local_b28 = fVar104;
  fStack_b24 = fVar104;
  fStack_b20 = fVar104;
  fStack_b1c = fVar104;
  local_b18 = fVar99;
  fStack_b14 = fVar99;
  fStack_b10 = fVar99;
  fStack_b0c = fVar99;
  local_b08 = fVar68;
  fStack_b04 = fVar68;
  fStack_b00 = fVar68;
  fStack_afc = fVar68;
  local_ab8 = uVar63;
  local_ab0 = uVar61;
  local_aa8 = uVar51;
  local_aa0 = uVar59;
  local_a98 = uVar57;
  local_a90 = uVar56;
LAB_00297db8:
  pNVar54 = local_a88;
  if (pNVar54 != stack) {
    local_a88 = pNVar54 + -1;
    sVar52 = pNVar54[-1].ptr;
    do {
      if ((sVar52 & 8) == 0) {
        uVar46 = sVar52 & 0xfffffffffffffff0;
        fVar161 = *(float *)(ray + k * 4 + 0x70);
        pfVar20 = (float *)(uVar46 + 0x80 + uVar56);
        pfVar19 = (float *)(uVar46 + 0x20 + uVar56);
        auVar90._0_4_ = ((*pfVar20 * fVar161 + *pfVar19) - fVar68) * fVar106;
        auVar90._4_4_ = ((pfVar20[1] * fVar161 + pfVar19[1]) - fVar130) * fVar111;
        auVar90._8_4_ = ((pfVar20[2] * fVar161 + pfVar19[2]) - fVar132) * fVar113;
        auVar90._12_4_ = ((pfVar20[3] * fVar161 + pfVar19[3]) - fVar72) * fVar115;
        auVar75._4_4_ = iVar144;
        auVar75._0_4_ = iVar60;
        auVar75._8_4_ = iVar146;
        auVar75._12_4_ = iVar148;
        pfVar20 = (float *)(uVar46 + 0x80 + uVar57);
        pfVar19 = (float *)(uVar46 + 0x20 + uVar57);
        auVar75 = maxps(auVar75,auVar90);
        auVar89._0_4_ = ((*pfVar20 * fVar161 + *pfVar19) - fVar99) * fVar124;
        auVar89._4_4_ = ((pfVar20[1] * fVar161 + pfVar19[1]) - fVar82) * fVar97;
        auVar89._8_4_ = ((pfVar20[2] * fVar161 + pfVar19[2]) - fVar83) * fVar98;
        auVar89._12_4_ = ((pfVar20[3] * fVar161 + pfVar19[3]) - fVar84) * fVar103;
        pfVar20 = (float *)(uVar46 + 0x80 + uVar59);
        pfVar19 = (float *)(uVar46 + 0x20 + uVar59);
        auVar93._0_4_ = ((*pfVar20 * fVar161 + *pfVar19) - fVar104) * fVar128;
        auVar93._4_4_ = ((pfVar20[1] * fVar161 + pfVar19[1]) - fVar88) * fVar105;
        auVar93._8_4_ = ((pfVar20[2] * fVar161 + pfVar19[2]) - fVar95) * fVar107;
        auVar93._12_4_ = ((pfVar20[3] * fVar161 + pfVar19[3]) - fVar96) * fVar109;
        auVar90 = maxps(auVar89,auVar93);
        auVar75 = maxps(auVar75,auVar90);
        pfVar20 = (float *)(uVar46 + 0x80 + uVar51);
        pfVar19 = (float *)(uVar46 + 0x20 + uVar51);
        auVar91._0_4_ = ((*pfVar20 * fVar161 + *pfVar19) - fVar68) * fVar106;
        auVar91._4_4_ = ((pfVar20[1] * fVar161 + pfVar19[1]) - fVar130) * fVar111;
        auVar91._8_4_ = ((pfVar20[2] * fVar161 + pfVar19[2]) - fVar132) * fVar113;
        auVar91._12_4_ = ((pfVar20[3] * fVar161 + pfVar19[3]) - fVar72) * fVar115;
        auVar86._4_4_ = iVar152;
        auVar86._0_4_ = iVar150;
        auVar86._8_4_ = iVar154;
        auVar86._12_4_ = iVar156;
        auVar90 = minps(auVar86,auVar91);
        pfVar21 = (float *)(uVar46 + 0x80 + uVar61);
        pfVar19 = (float *)(uVar46 + 0x20 + uVar61);
        pfVar22 = (float *)(uVar46 + 0x80 + uVar63);
        pfVar20 = (float *)(uVar46 + 0x20 + uVar63);
        auVar92._0_4_ = ((*pfVar21 * fVar161 + *pfVar19) - fVar99) * fVar124;
        auVar92._4_4_ = ((pfVar21[1] * fVar161 + pfVar19[1]) - fVar82) * fVar97;
        auVar92._8_4_ = ((pfVar21[2] * fVar161 + pfVar19[2]) - fVar83) * fVar98;
        auVar92._12_4_ = ((pfVar21[3] * fVar161 + pfVar19[3]) - fVar84) * fVar103;
        auVar100._0_4_ = ((*pfVar22 * fVar161 + *pfVar20) - fVar104) * fVar128;
        auVar100._4_4_ = ((pfVar22[1] * fVar161 + pfVar20[1]) - fVar88) * fVar105;
        auVar100._8_4_ = ((pfVar22[2] * fVar161 + pfVar20[2]) - fVar95) * fVar107;
        auVar100._12_4_ = ((pfVar22[3] * fVar161 + pfVar20[3]) - fVar96) * fVar109;
        auVar93 = minps(auVar92,auVar100);
        auVar90 = minps(auVar90,auVar93);
        bVar66 = auVar75._0_4_ <= auVar90._0_4_;
        bVar67 = auVar75._4_4_ <= auVar90._4_4_;
        bVar35 = auVar75._8_4_ <= auVar90._8_4_;
        bVar36 = auVar75._12_4_ <= auVar90._12_4_;
        if (((uint)sVar52 & 7) == 6) {
          bVar66 = (fVar161 < *(float *)(uVar46 + 0xf0) && *(float *)(uVar46 + 0xe0) <= fVar161) &&
                   bVar66;
          bVar67 = (fVar161 < *(float *)(uVar46 + 0xf4) && *(float *)(uVar46 + 0xe4) <= fVar161) &&
                   bVar67;
          bVar35 = (fVar161 < *(float *)(uVar46 + 0xf8) && *(float *)(uVar46 + 0xe8) <= fVar161) &&
                   bVar35;
          bVar36 = (fVar161 < *(float *)(uVar46 + 0xfc) && *(float *)(uVar46 + 0xec) <= fVar161) &&
                   bVar36;
        }
        auVar76._0_4_ = (uint)bVar66 * -0x80000000;
        auVar76._4_4_ = (uint)bVar67 * -0x80000000;
        auVar76._8_4_ = (uint)bVar35 * -0x80000000;
        auVar76._12_4_ = (uint)bVar36 * -0x80000000;
        uVar53 = movmskps((int)bvh,auVar76);
        bvh = (BVH *)CONCAT44((int)((ulong)bvh >> 0x20),uVar53);
      }
      if ((sVar52 & 8) == 0) {
        if (bvh == (BVH *)0x0) {
          uVar73 = 4;
        }
        else {
          uVar46 = sVar52 & 0xfffffffffffffff0;
          lVar48 = 0;
          if (bvh != (BVH *)0x0) {
            for (; ((ulong)bvh >> lVar48 & 1) == 0; lVar48 = lVar48 + 1) {
            }
          }
          sVar52 = *(size_t *)(uVar46 + lVar48 * 8);
          uVar50 = (ulong)&bvh[-1].field_0x23f & (ulong)bvh;
          if (uVar50 != 0) {
            local_a88->ptr = sVar52;
            lVar48 = 0;
            if (uVar50 != 0) {
              for (; (uVar50 >> lVar48 & 1) == 0; lVar48 = lVar48 + 1) {
              }
            }
            uVar47 = uVar50 - 1;
            while( true ) {
              local_a88 = local_a88 + 1;
              sVar52 = *(size_t *)(uVar46 + lVar48 * 8);
              uVar47 = uVar47 & uVar50;
              if (uVar47 == 0) break;
              local_a88->ptr = sVar52;
              lVar48 = 0;
              if (uVar47 != 0) {
                for (; (uVar47 >> lVar48 & 1) == 0; lVar48 = lVar48 + 1) {
                }
              }
              uVar50 = uVar47 - 1;
            }
          }
          uVar73 = 0;
        }
      }
      else {
        uVar73 = 6;
      }
    } while (uVar73 == 0);
    if (uVar73 == 6) {
      uVar46 = (ulong)((uint)sVar52 & 0xf);
      uVar73 = 0;
      uVar50 = uVar46 - 8;
      bVar66 = uVar46 != 8;
      if (bVar66) {
        uVar56 = sVar52 & 0xfffffffffffffff0;
        uVar51 = 0;
        do {
          lVar48 = uVar51 * 0x60;
          pSVar55 = context->scene;
          pRVar25 = (pSVar55->geometries).items;
          pGVar26 = pRVar25[*(uint *)(uVar56 + 0x40 + lVar48)].ptr;
          fVar68 = (pGVar26->time_range).lower;
          fVar161 = ((*(float *)(ray + k * 4 + 0x70) - fVar68) /
                    ((pGVar26->time_range).upper - fVar68)) * pGVar26->fnumTimeSegments;
          auVar77 = roundss(ZEXT416((uint)fVar68),ZEXT416((uint)fVar161),9);
          fVar68 = pGVar26->fnumTimeSegments + -1.0;
          if (fVar68 <= auVar77._0_4_) {
            auVar77._0_4_ = fVar68;
          }
          fVar68 = 0.0;
          if (0.0 <= auVar77._0_4_) {
            fVar68 = auVar77._0_4_;
          }
          fVar161 = fVar161 - fVar68;
          lVar58 = (long)(int)fVar68 * 0x38;
          lVar27 = *(long *)(*(long *)&pGVar26[2].numPrimitives + lVar58);
          uVar59 = (ulong)*(uint *)(uVar56 + 4 + lVar48);
          pfVar19 = (float *)(lVar27 + (ulong)*(uint *)(uVar56 + lVar48) * 4);
          uVar63 = (ulong)*(uint *)(uVar56 + 0x10 + lVar48);
          pfVar20 = (float *)(lVar27 + uVar63 * 4);
          uVar73 = *(uint *)(uVar56 + 0x30 + lVar48);
          pfVar21 = (float *)(lVar27 + (ulong)uVar73 * 4);
          lVar28 = *(long *)&pRVar25[*(uint *)(uVar56 + 0x44 + lVar48)].ptr[2].numPrimitives;
          lVar29 = *(long *)(lVar28 + lVar58);
          pfVar22 = (float *)(lVar29 + uVar59 * 4);
          uVar57 = (ulong)*(uint *)(uVar56 + 0x14 + lVar48);
          pfVar1 = (float *)(lVar29 + uVar57 * 4);
          lVar64 = (long)((int)fVar68 + 1) * 0x38;
          lVar30 = *(long *)(*(long *)&pGVar26[2].numPrimitives + lVar64);
          pfVar2 = (float *)(lVar30 + (ulong)*(uint *)(uVar56 + lVar48) * 4);
          uVar61 = (ulong)*(uint *)(uVar56 + 0x34 + lVar48);
          pfVar3 = (float *)(lVar29 + uVar61 * 4);
          lVar31 = *(long *)&pRVar25[*(uint *)(uVar56 + 0x48 + lVar48)].ptr[2].numPrimitives;
          pfVar4 = (float *)(lVar30 + uVar63 * 4);
          lVar32 = *(long *)(lVar31 + lVar58);
          lVar33 = *(long *)(lVar28 + lVar64);
          pfVar5 = (float *)(lVar33 + uVar59 * 4);
          uVar63 = (ulong)*(uint *)(uVar56 + 8 + lVar48);
          lVar31 = *(long *)(lVar31 + lVar64);
          pfVar6 = (float *)(lVar31 + uVar63 * 4);
          uVar62 = (ulong)*(uint *)(uVar56 + 0x18 + lVar48);
          piVar7 = (int *)(lVar32 + uVar62 * 4);
          iVar150 = *piVar7;
          iStack_ac8 = piVar7[2];
          lVar28 = *(long *)&pRVar25[*(uint *)(uVar56 + 0x4c + lVar48)].ptr[2].numPrimitives;
          lVar58 = *(long *)(lVar28 + lVar58);
          lVar64 = *(long *)(lVar28 + lVar64);
          uVar59 = (ulong)*(uint *)(uVar56 + 0x38 + lVar48);
          pfVar8 = (float *)(lVar32 + uVar59 * 4);
          uVar65 = (ulong)*(uint *)(uVar56 + 0xc + lVar48);
          uVar46 = (ulong)*(uint *)(uVar56 + 0x1c + lVar48);
          piVar9 = (int *)(lVar58 + uVar46 * 4);
          iVar152 = *piVar9;
          iStack_ac4 = piVar9[2];
          uVar47 = (ulong)*(uint *)(uVar56 + 0x3c + lVar48);
          pfVar10 = (float *)(lVar58 + uVar47 * 4);
          pfVar11 = (float *)(lVar64 + uVar65 * 4);
          pfVar12 = (float *)(lVar31 + uVar62 * 4);
          pfVar13 = (float *)(lVar33 + uVar57 * 4);
          pfVar14 = (float *)(lVar64 + uVar46 * 4);
          pfVar15 = (float *)(lVar30 + (ulong)uVar73 * 4);
          pfVar16 = (float *)(lVar31 + uVar59 * 4);
          pfVar17 = (float *)(lVar33 + uVar61 * 4);
          pfVar18 = (float *)(lVar64 + uVar47 * 4);
          local_808 = 1.0 - fVar161;
          fVar149 = *pfVar19 * local_808 + *pfVar2 * fVar161;
          fVar151 = *pfVar22 * local_808 + *pfVar5 * fVar161;
          fVar153 = fStack_bd0 * local_808 + *pfVar6 * fVar161;
          fVar155 = fStack_bcc * local_808 + *pfVar11 * fVar161;
          fVar88 = pfVar19[1] * local_808 + pfVar2[1] * fVar161;
          fVar95 = pfVar22[1] * local_808 + pfVar5[1] * fVar161;
          fVar96 = *(float *)(lVar32 + uVar63 * 4 + 4) * local_808 + pfVar6[1] * fVar161;
          fVar97 = *(float *)(lVar58 + uVar65 * 4 + 4) * local_808 + pfVar11[1] * fVar161;
          fVar124 = pfVar19[2] * local_808 + pfVar2[2] * fVar161;
          fVar128 = pfVar22[2] * local_808 + pfVar5[2] * fVar161;
          fVar130 = fStack_ba0 * local_808 + pfVar6[2] * fVar161;
          fVar132 = fStack_b9c * local_808 + pfVar11[2] * fVar161;
          local_b88._0_4_ = *pfVar20 * local_808 + *pfVar4 * fVar161;
          local_b88._4_4_ = *pfVar1 * local_808 + *pfVar13 * fVar161;
          fStack_b80 = fStack_b80 * local_808 + *pfVar12 * fVar161;
          fStack_b7c = fStack_b7c * local_808 + *pfVar14 * fVar161;
          local_af8 = pfVar20[1] * local_808 + pfVar4[1] * fVar161;
          fStack_af4 = pfVar1[1] * local_808 + pfVar13[1] * fVar161;
          fStack_af0 = (float)piVar7[1] * local_808 + pfVar12[1] * fVar161;
          fStack_aec = (float)piVar9[1] * local_808 + pfVar14[1] * fVar161;
          local_ad8 = pfVar20[2] * local_808 + pfVar4[2] * fVar161;
          fStack_ad4 = pfVar1[2] * local_808 + pfVar13[2] * fVar161;
          fStack_ad0 = fStack_ad0 * local_808 + pfVar12[2] * fVar161;
          fStack_acc = fStack_acc * local_808 + pfVar14[2] * fVar161;
          local_7f8 = *pfVar21 * local_808 + *pfVar15 * fVar161;
          fStack_7f4 = *pfVar3 * local_808 + *pfVar17 * fVar161;
          fStack_7f0 = *pfVar8 * local_808 + *pfVar16 * fVar161;
          fStack_7ec = *pfVar10 * local_808 + *pfVar18 * fVar161;
          local_7e8 = pfVar21[1] * local_808 + pfVar15[1] * fVar161;
          fStack_7e4 = pfVar3[1] * local_808 + pfVar17[1] * fVar161;
          fStack_7e0 = pfVar8[1] * local_808 + pfVar16[1] * fVar161;
          fStack_7dc = pfVar10[1] * local_808 + pfVar18[1] * fVar161;
          fStack_804 = local_808;
          fStack_800 = local_808;
          fStack_7fc = local_808;
          fVar108 = pfVar21[2] * local_808 + pfVar15[2] * fVar161;
          fVar110 = pfVar3[2] * local_808 + pfVar17[2] * fVar161;
          fVar112 = pfVar8[2] * local_808 + pfVar16[2] * fVar161;
          fVar114 = pfVar10[2] * local_808 + pfVar18[2] * fVar161;
          fVar109 = fVar88 - local_af8;
          fVar111 = fVar95 - fStack_af4;
          fVar113 = fVar96 - fStack_af0;
          fVar115 = fVar97 - fStack_aec;
          fVar134 = fVar124 - local_ad8;
          fVar136 = fVar128 - fStack_ad4;
          fVar138 = fVar130 - fStack_ad0;
          fVar140 = fVar132 - fStack_acc;
          fVar116 = local_7e8 - fVar88;
          fVar118 = fStack_7e4 - fVar95;
          fVar120 = fStack_7e0 - fVar96;
          fVar122 = fStack_7dc - fVar97;
          fVar125 = fVar108 - fVar124;
          fVar129 = fVar110 - fVar128;
          fVar131 = fVar112 - fVar130;
          fVar133 = fVar114 - fVar132;
          fVar72 = fVar134 * fVar116 - fVar109 * fVar125;
          fVar82 = fVar136 * fVar118 - fVar111 * fVar129;
          fVar83 = fVar138 * fVar120 - fVar113 * fVar131;
          fVar84 = fVar140 * fVar122 - fVar115 * fVar133;
          fVar98 = local_7f8 - fVar149;
          fVar103 = fStack_7f4 - fVar151;
          fVar105 = fStack_7f0 - fVar153;
          fVar107 = fStack_7ec - fVar155;
          fVar68 = *(float *)(ray + k * 4);
          fVar162 = fVar149 - fVar68;
          fVar166 = fVar151 - fVar68;
          fVar168 = fVar153 - fVar68;
          fVar68 = fVar155 - fVar68;
          fVar99 = *(float *)(ray + k * 4 + 0x10);
          fVar88 = fVar88 - fVar99;
          fVar95 = fVar95 - fVar99;
          fVar96 = fVar96 - fVar99;
          fVar97 = fVar97 - fVar99;
          fVar99 = *(float *)(ray + k * 4 + 0x40);
          fVar104 = *(float *)(ray + k * 4 + 0x50);
          fVar157 = fVar162 * fVar104 - fVar88 * fVar99;
          fVar158 = fVar166 * fVar104 - fVar95 * fVar99;
          fVar159 = fVar168 * fVar104 - fVar96 * fVar99;
          fVar160 = fVar68 * fVar104 - fVar97 * fVar99;
          fVar149 = fVar149 - (float)local_b88;
          fVar151 = fVar151 - local_b88._4_4_;
          fVar153 = fVar153 - fStack_b80;
          fVar155 = fVar155 - fStack_b7c;
          local_908._0_4_ = fVar149 * fVar125 - fVar134 * fVar98;
          local_908._4_4_ = fVar151 * fVar129 - fVar136 * fVar103;
          local_908._8_4_ = fVar153 * fVar131 - fVar138 * fVar105;
          local_908._12_4_ = fVar155 * fVar133 - fVar140 * fVar107;
          fVar106 = *(float *)(ray + k * 4 + 0x20);
          fVar124 = fVar124 - fVar106;
          fVar128 = fVar128 - fVar106;
          fVar130 = fVar130 - fVar106;
          fVar132 = fVar132 - fVar106;
          fVar106 = *(float *)(ray + k * 4 + 0x60);
          fVar163 = fVar124 * fVar99 - fVar162 * fVar106;
          fVar167 = fVar128 * fVar99 - fVar166 * fVar106;
          fVar169 = fVar130 * fVar99 - fVar168 * fVar106;
          fVar170 = fVar132 * fVar99 - fVar68 * fVar106;
          local_8f8._0_4_ = fVar109 * fVar98 - fVar149 * fVar116;
          local_8f8._4_4_ = fVar111 * fVar103 - fVar151 * fVar118;
          fStack_8f0 = fVar113 * fVar105 - fVar153 * fVar120;
          fStack_8ec = fVar115 * fVar107 - fVar155 * fVar122;
          fVar135 = fVar88 * fVar106 - fVar124 * fVar104;
          fVar137 = fVar95 * fVar106 - fVar128 * fVar104;
          fVar139 = fVar96 * fVar106 - fVar130 * fVar104;
          fVar141 = fVar97 * fVar106 - fVar132 * fVar104;
          fVar142 = fVar99 * fVar72 +
                    fVar104 * (float)local_908._0_4_ + fVar106 * (float)local_8f8._0_4_;
          fVar143 = fVar99 * fVar82 +
                    fVar104 * (float)local_908._4_4_ + fVar106 * (float)local_8f8._4_4_;
          fVar145 = fVar99 * fVar83 + fVar104 * (float)local_908._8_4_ + fVar106 * fStack_8f0;
          fVar147 = fVar99 * fVar84 + fVar104 * (float)local_908._12_4_ + fVar106 * fStack_8ec;
          uVar117 = (uint)fVar142 & 0x80000000;
          uVar119 = (uint)fVar143 & 0x80000000;
          uVar121 = (uint)fVar145 & 0x80000000;
          uVar123 = (uint)fVar147 & 0x80000000;
          fVar99 = (float)((uint)(fVar98 * fVar135 + fVar116 * fVar163 + fVar125 * fVar157) ^
                          uVar117);
          fVar104 = (float)((uint)(fVar103 * fVar137 + fVar118 * fVar167 + fVar129 * fVar158) ^
                           uVar119);
          fVar106 = (float)((uint)(fVar105 * fVar139 + fVar120 * fVar169 + fVar131 * fVar159) ^
                           uVar121);
          fVar98 = (float)((uint)(fVar107 * fVar141 + fVar122 * fVar170 + fVar133 * fVar160) ^
                          uVar123);
          fVar107 = (float)((uint)(fVar135 * fVar149 + fVar163 * fVar109 + fVar157 * fVar134) ^
                           uVar117);
          fVar109 = (float)((uint)(fVar137 * fVar151 + fVar167 * fVar111 + fVar158 * fVar136) ^
                           uVar119);
          fVar111 = (float)((uint)(fVar139 * fVar153 + fVar169 * fVar113 + fVar159 * fVar138) ^
                           uVar121);
          fVar113 = (float)((uint)(fVar141 * fVar155 + fVar170 * fVar115 + fVar160 * fVar140) ^
                           uVar123);
          fVar103 = ABS(fVar142);
          fVar105 = ABS(fVar143);
          auVar126._0_8_ = CONCAT44(fVar143,fVar142) & 0x7fffffff7fffffff;
          auVar126._8_4_ = ABS(fVar145);
          auVar126._12_4_ = ABS(fVar147);
          bVar36 = ((0.0 <= fVar107 && 0.0 <= fVar99) && fVar142 != 0.0) &&
                   fVar99 + fVar107 <= fVar103;
          bVar42 = ((0.0 <= fVar109 && 0.0 <= fVar104) && fVar143 != 0.0) &&
                   fVar104 + fVar109 <= fVar105;
          bVar35 = ((0.0 <= fVar111 && 0.0 <= fVar106) && fVar145 != 0.0) &&
                   fVar106 + fVar111 <= auVar126._8_4_;
          bVar67 = ((0.0 <= fVar113 && 0.0 <= fVar98) && fVar147 != 0.0) &&
                   fVar98 + fVar113 <= auVar126._12_4_;
          lVar28 = uVar56 + lVar48;
          uVar61 = (ulong)*(uint *)(uVar56 + 0x20 + lVar48);
          uVar57 = (ulong)*(uint *)(uVar56 + 0x24 + lVar48);
          uVar59 = (ulong)*(uint *)(uVar56 + 0x28 + lVar48);
          uVar45 = *(uint *)(uVar56 + 0x2c + lVar48);
          auVar41._4_4_ = -(uint)bVar42;
          auVar41._0_4_ = -(uint)bVar36;
          auVar41._8_4_ = -(uint)bVar35;
          auVar41._12_4_ = -(uint)bVar67;
          iVar60 = movmskps(uVar73,auVar41);
          pfVar19 = (float *)(lVar27 + uVar61 * 4);
          local_ae8 = *pfVar19;
          fStack_ae4 = pfVar19[1];
          fStack_ae0 = pfVar19[2];
          fStack_adc = pfVar19[3];
          pfVar19 = (float *)(lVar30 + uVar61 * 4);
          fVar116 = *pfVar19;
          fVar118 = pfVar19[1];
          fVar120 = pfVar19[2];
          pfVar19 = (float *)(lVar29 + uVar57 * 4);
          fVar122 = *pfVar19;
          fVar125 = pfVar19[1];
          fVar129 = pfVar19[2];
          pfVar19 = (float *)(lVar33 + uVar57 * 4);
          local_ba8 = *pfVar19;
          fStack_ba4 = pfVar19[1];
          uVar44 = *(undefined8 *)pfVar19;
          fStack_ba0 = pfVar19[2];
          fStack_b9c = pfVar19[3];
          auVar75 = *(undefined1 (*) [16])(lVar32 + uVar59 * 4);
          auVar74 = auVar75._0_12_;
          auVar90 = *(undefined1 (*) [16])(lVar31 + uVar59 * 4);
          auVar93 = *(undefined1 (*) [16])(lVar58 + (ulong)uVar45 * 4);
          auVar85 = auVar93._0_12_;
          pfVar19 = (float *)(lVar64 + (ulong)uVar45 * 4);
          local_9f8 = *pfVar19;
          fStack_9f4 = pfVar19[1];
          uVar43 = *(undefined8 *)pfVar19;
          fVar131 = pfVar19[2];
          local_b78 = iVar150;
          iStack_b74 = iVar152;
          local_a80 = pSVar55;
          if (iVar60 != 0) {
            fVar88 = (float)(uVar117 ^
                            (uint)(fVar162 * fVar72 +
                                  fVar88 * (float)local_908._0_4_ + fVar124 * (float)local_8f8._0_4_
                                  ));
            fVar128 = (float)(uVar119 ^
                             (uint)(fVar166 * fVar82 +
                                   fVar95 * (float)local_908._4_4_ +
                                   fVar128 * (float)local_8f8._4_4_));
            fVar130 = (float)(uVar121 ^
                             (uint)(fVar168 * fVar83 +
                                   fVar96 * (float)local_908._8_4_ + fVar130 * fStack_8f0));
            fVar132 = (float)(uVar123 ^
                             (uint)(fVar68 * fVar84 +
                                   fVar97 * (float)local_908._12_4_ + fVar132 * fStack_8ec));
            fVar68 = *(float *)(ray + k * 4 + 0x30);
            fVar124 = *(float *)(ray + k * 4 + 0x80);
            fStack_bd0 = fVar124 * auVar126._8_4_;
            fStack_bcc = fVar124 * auVar126._12_4_;
            auVar164._0_4_ =
                 -(uint)((fVar68 * fVar103 < fVar88 && fVar88 <= fVar124 * fVar103) && bVar36);
            auVar164._4_4_ =
                 -(uint)((fVar68 * fVar105 < fVar128 && fVar128 <= fVar124 * fVar105) && bVar42);
            auVar164._8_4_ =
                 -(uint)((fVar68 * auVar126._8_4_ < fVar130 && fVar130 <= fStack_bd0) && bVar35);
            auVar164._12_4_ =
                 -(uint)((fVar68 * auVar126._12_4_ < fVar132 && fVar132 <= fStack_bcc) && bVar67);
            uVar45 = movmskps(uVar45,auVar164);
            if (uVar45 != 0) {
              local_848 = auVar75;
              local_838 = auVar93;
              local_918._4_4_ = fVar82;
              local_918._0_4_ = fVar72;
              fStack_910 = fVar83;
              fStack_90c = fVar84;
              local_8e8._8_8_ = uStack_810;
              local_8e8._0_8_ = local_818;
              auVar75 = rcpps(auVar93,auVar126);
              fVar68 = auVar75._0_4_;
              fVar124 = auVar75._4_4_;
              fVar72 = auVar75._8_4_;
              fVar82 = auVar75._12_4_;
              fVar83 = (float)DAT_01feca10;
              fVar84 = DAT_01feca10._4_4_;
              fVar95 = DAT_01feca10._8_4_;
              fVar96 = DAT_01feca10._12_4_;
              fVar68 = (fVar83 - fVar103 * fVar68) * fVar68 + fVar68;
              fVar124 = (fVar84 - fVar105 * fVar124) * fVar124 + fVar124;
              fVar72 = (fVar95 - auVar126._8_4_ * fVar72) * fVar72 + fVar72;
              fVar82 = (fVar96 - auVar126._12_4_ * fVar82) * fVar82 + fVar82;
              local_928._4_4_ = fVar128 * fVar124;
              local_928._0_4_ = fVar88 * fVar68;
              fStack_920 = fVar130 * fVar72;
              fStack_91c = fVar132 * fVar82;
              auVar101._0_4_ = fVar99 * fVar68;
              auVar101._4_4_ = fVar104 * fVar124;
              auVar101._8_4_ = fVar106 * fVar72;
              auVar101._12_4_ = fVar98 * fVar82;
              auVar93 = minps(auVar101,_DAT_01feca10);
              auVar94._0_4_ = fVar68 * fVar107;
              auVar94._4_4_ = fVar124 * fVar109;
              auVar94._8_4_ = fVar72 * fVar111;
              auVar94._12_4_ = fVar82 * fVar113;
              auVar75 = minps(auVar94,_DAT_01feca10);
              auVar87._0_4_ = fVar83 - auVar93._0_4_;
              auVar87._4_4_ = fVar84 - auVar93._4_4_;
              auVar87._8_4_ = fVar95 - auVar93._8_4_;
              auVar87._12_4_ = fVar96 - auVar93._12_4_;
              local_948 = blendvps(auVar93,auVar87,local_8e8);
              auVar40._4_4_ = fVar84 - auVar75._4_4_;
              auVar40._0_4_ = fVar83 - auVar75._0_4_;
              auVar40._8_4_ = fVar95 - auVar75._8_4_;
              auVar40._12_4_ = fVar96 - auVar75._12_4_;
              local_938 = blendvps(auVar75,auVar40,local_8e8);
              uVar57 = (ulong)(byte)uVar45;
              fVar68 = local_b08;
              fVar130 = fStack_b04;
              fVar132 = fStack_b00;
              fVar72 = fStack_afc;
              fVar99 = local_b18;
              fVar82 = fStack_b14;
              fVar83 = fStack_b10;
              fVar84 = fStack_b0c;
              fVar104 = local_b28;
              fVar88 = fStack_b24;
              fVar95 = fStack_b20;
              fVar96 = fStack_b1c;
              fVar124 = local_b48;
              fVar97 = fStack_b44;
              fVar98 = fStack_b40;
              fVar103 = fStack_b3c;
              fVar128 = local_b58;
              fVar105 = fStack_b54;
              fVar107 = fStack_b50;
              fVar109 = fStack_b4c;
              iVar60 = local_b68;
              iVar144 = iStack_b64;
              iVar146 = iStack_b60;
              iVar148 = iStack_b5c;
              iVar154 = iStack_b70;
              iVar156 = iStack_b6c;
              fVar106 = local_b38;
              fVar111 = fStack_b34;
              fVar113 = fStack_b30;
              fVar115 = fStack_b2c;
              do {
                uVar59 = 0;
                if (uVar57 != 0) {
                  for (; (uVar57 >> uVar59 & 1) == 0; uVar59 = uVar59 + 1) {
                  }
                }
                local_878 = *(uint *)(lVar28 + 0x40 + uVar59 * 4);
                pGVar26 = (pSVar55->geometries).items[local_878].ptr;
                if ((pGVar26->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                  uVar57 = uVar57 ^ 1L << (uVar59 & 0x3f);
                  uVar45 = (uint)CONCAT71((uint7)(uint3)(*(uint *)(ray + k * 4 + 0x90) >> 8),1);
                }
                else if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                        (pGVar26->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                  uVar45 = 0;
                }
                else {
                  uVar53 = *(undefined4 *)(ray + k * 4 + 0x80);
                  local_8a8 = *(undefined4 *)(local_948 + uVar59 * 4);
                  uVar24 = *(undefined4 *)(local_938 + uVar59 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_928 + uVar59 * 4);
                  args.context = context->user;
                  uVar23 = *(undefined4 *)(lVar28 + 0x50 + uVar59 * 4);
                  local_888._4_4_ = uVar23;
                  local_888._0_4_ = uVar23;
                  local_888._8_4_ = uVar23;
                  local_888._12_4_ = uVar23;
                  local_898._4_4_ = uVar24;
                  local_898._0_4_ = uVar24;
                  local_898._8_4_ = uVar24;
                  local_898._12_4_ = uVar24;
                  uVar24 = *(undefined4 *)(local_918 + uVar59 * 4);
                  local_8c8 = *(undefined4 *)(local_908 + uVar59 * 4);
                  local_8b8 = *(undefined4 *)(local_8f8 + uVar59 * 4);
                  local_8d8[0] = (RTCHitN)(char)uVar24;
                  local_8d8[1] = (RTCHitN)(char)((uint)uVar24 >> 8);
                  local_8d8[2] = (RTCHitN)(char)((uint)uVar24 >> 0x10);
                  local_8d8[3] = (RTCHitN)(char)((uint)uVar24 >> 0x18);
                  local_8d8[4] = (RTCHitN)(char)uVar24;
                  local_8d8[5] = (RTCHitN)(char)((uint)uVar24 >> 8);
                  local_8d8[6] = (RTCHitN)(char)((uint)uVar24 >> 0x10);
                  local_8d8[7] = (RTCHitN)(char)((uint)uVar24 >> 0x18);
                  local_8d8[8] = (RTCHitN)(char)uVar24;
                  local_8d8[9] = (RTCHitN)(char)((uint)uVar24 >> 8);
                  local_8d8[10] = (RTCHitN)(char)((uint)uVar24 >> 0x10);
                  local_8d8[0xb] = (RTCHitN)(char)((uint)uVar24 >> 0x18);
                  local_8d8[0xc] = (RTCHitN)(char)uVar24;
                  local_8d8[0xd] = (RTCHitN)(char)((uint)uVar24 >> 8);
                  local_8d8[0xe] = (RTCHitN)(char)((uint)uVar24 >> 0x10);
                  local_8d8[0xf] = (RTCHitN)(char)((uint)uVar24 >> 0x18);
                  uStack_8c4 = local_8c8;
                  uStack_8c0 = local_8c8;
                  uStack_8bc = local_8c8;
                  uStack_8b4 = local_8b8;
                  uStack_8b0 = local_8b8;
                  uStack_8ac = local_8b8;
                  uStack_8a4 = local_8a8;
                  uStack_8a0 = local_8a8;
                  uStack_89c = local_8a8;
                  uStack_874 = local_878;
                  uStack_870 = local_878;
                  uStack_86c = local_878;
                  local_868 = (args.context)->instID[0];
                  uStack_864 = local_868;
                  uStack_860 = local_868;
                  uStack_85c = local_868;
                  local_858 = (args.context)->instPrimID[0];
                  uStack_854 = local_858;
                  uStack_850 = local_858;
                  uStack_84c = local_858;
                  local_b98 = *local_ac0;
                  args.valid = (int *)local_b98;
                  args.geometryUserPtr = pGVar26->userPtr;
                  args.hit = local_8d8;
                  args.N = 4;
                  pRVar49 = (RTCRayN *)pGVar26->occlusionFilterN;
                  args.ray = (RTCRayN *)ray;
                  if (pRVar49 != (RTCRayN *)0x0) {
                    pRVar49 = (RTCRayN *)(*(code *)pRVar49)(&args);
                  }
                  if (local_b98 == (undefined1  [16])0x0) {
                    auVar78._8_4_ = 0xffffffff;
                    auVar78._0_8_ = 0xffffffffffffffff;
                    auVar78._12_4_ = 0xffffffff;
                    auVar78 = auVar78 ^ _DAT_01febe20;
                  }
                  else {
                    p_Var34 = context->args->filter;
                    if ((p_Var34 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar26->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var34)(&args);
                    }
                    auVar69._0_4_ = -(uint)(local_b98._0_4_ == 0);
                    auVar69._4_4_ = -(uint)(local_b98._4_4_ == 0);
                    auVar69._8_4_ = -(uint)(local_b98._8_4_ == 0);
                    auVar69._12_4_ = -(uint)(local_b98._12_4_ == 0);
                    auVar78 = auVar69 ^ _DAT_01febe20;
                    auVar75 = blendvps(_DAT_01feba00,*(undefined1 (*) [16])(args.ray + 0x80),auVar69
                                      );
                    *(undefined1 (*) [16])(args.ray + 0x80) = auVar75;
                    pRVar49 = args.ray;
                  }
                  auVar79._0_4_ = auVar78._0_4_ << 0x1f;
                  auVar79._4_4_ = auVar78._4_4_ << 0x1f;
                  auVar79._8_4_ = auVar78._8_4_ << 0x1f;
                  auVar79._12_4_ = auVar78._12_4_ << 0x1f;
                  iVar60 = movmskps((int)pRVar49,auVar79);
                  uVar45 = CONCAT31((int3)((uint)iVar60 >> 8),iVar60 == 0);
                  if (iVar60 == 0) {
                    *(undefined4 *)(ray + k * 4 + 0x80) = uVar53;
                    uVar57 = uVar57 ^ 1L << (uVar59 & 0x3f);
                  }
                  pSVar55 = local_a80;
                  fVar68 = local_b08;
                  fVar130 = fStack_b04;
                  fVar132 = fStack_b00;
                  fVar72 = fStack_afc;
                  fVar99 = local_b18;
                  fVar82 = fStack_b14;
                  fVar83 = fStack_b10;
                  fVar84 = fStack_b0c;
                  fVar104 = local_b28;
                  fVar88 = fStack_b24;
                  fVar95 = fStack_b20;
                  fVar96 = fStack_b1c;
                  fVar124 = local_b48;
                  fVar97 = fStack_b44;
                  fVar98 = fStack_b40;
                  fVar103 = fStack_b3c;
                  fVar128 = local_b58;
                  fVar105 = fStack_b54;
                  fVar107 = fStack_b50;
                  fVar109 = fStack_b4c;
                  iVar60 = local_b68;
                  iVar144 = iStack_b64;
                  iVar146 = iStack_b60;
                  iVar148 = iStack_b5c;
                  iVar150 = local_b78;
                  iVar152 = iStack_b74;
                  iVar154 = iStack_b70;
                  iVar156 = iStack_b6c;
                  fVar106 = local_b38;
                  fVar111 = fStack_b34;
                  fVar113 = fStack_b30;
                  fVar115 = fStack_b2c;
                }
                if ((char)uVar45 == '\0') goto LAB_0029921f;
              } while (uVar57 != 0);
              local_ba8 = (float)uVar44;
              fStack_ba4 = (float)((ulong)uVar44 >> 0x20);
              local_9f8 = (float)uVar43;
              fStack_9f4 = (float)((ulong)uVar43 >> 0x20);
              auVar85 = local_838._0_12_;
              auVar74 = local_848._0_12_;
            }
          }
          fVar113 = local_ae8 * local_808 + fVar116 * fVar161;
          fVar115 = fVar122 * fStack_804 + local_ba8 * fVar161;
          fVar116 = auVar74._0_4_ * fStack_800 + auVar90._0_4_ * fVar161;
          fVar122 = auVar85._0_4_ * fStack_7fc + local_9f8 * fVar161;
          fVar130 = fStack_ae4 * local_808 + fVar118 * fVar161;
          fVar132 = fVar125 * fStack_804 + fStack_ba4 * fVar161;
          fVar72 = auVar74._4_4_ * fStack_800 + auVar90._4_4_ * fVar161;
          fVar82 = auVar85._4_4_ * fStack_7fc + fStack_9f4 * fVar161;
          fVar139 = fStack_ae0 * local_808 + fVar120 * fVar161;
          fVar140 = fVar129 * fStack_804 + fStack_ba0 * fVar161;
          fStack_ae0 = auVar74._8_4_ * fStack_800 + auVar90._8_4_ * fVar161;
          fStack_adc = auVar85._8_4_ * fStack_7fc + fVar131 * fVar161;
          fVar83 = fVar113 - local_7f8;
          fVar88 = fVar115 - fStack_7f4;
          fStack_bd0 = fVar116 - fStack_7f0;
          fStack_bcc = fVar122 - fStack_7ec;
          fVar84 = fVar130 - local_7e8;
          fVar95 = fVar132 - fStack_7e4;
          fStack_ba0 = fVar72 - fStack_7e0;
          fStack_b9c = fVar82 - fStack_7dc;
          fVar108 = fVar139 - fVar108;
          fVar110 = fVar140 - fVar110;
          fVar112 = fStack_ae0 - fVar112;
          fVar114 = fStack_adc - fVar114;
          local_b88._0_4_ = (float)local_b88 - fVar113;
          local_b88._4_4_ = local_b88._4_4_ - fVar115;
          fVar141 = fStack_b80 - fVar116;
          fVar149 = fStack_b7c - fVar122;
          fVar103 = local_af8 - fVar130;
          fVar105 = fStack_af4 - fVar132;
          fVar107 = fStack_af0 - fVar72;
          fVar109 = fStack_aec - fVar82;
          local_ad8 = local_ad8 - fVar139;
          fVar96 = fStack_ad4 - fVar140;
          fVar97 = fStack_ad0 - fStack_ae0;
          fVar98 = fStack_acc - fStack_adc;
          local_918._0_4_ = fVar103 * fVar108 - local_ad8 * fVar84;
          local_918._4_4_ = fVar105 * fVar110 - fVar96 * fVar95;
          fStack_910 = fVar107 * fVar112 - fVar97 * fStack_ba0;
          fStack_90c = fVar109 * fVar114 - fVar98 * fStack_b9c;
          local_908._0_4_ = local_ad8 * fVar83 - (float)local_b88 * fVar108;
          local_908._4_4_ = fVar96 * fVar88 - local_b88._4_4_ * fVar110;
          local_908._8_4_ = fVar97 * fStack_bd0 - fVar141 * fVar112;
          local_908._12_4_ = fVar98 * fStack_bcc - fVar149 * fVar114;
          local_8f8._0_4_ = (float)local_b88 * fVar84 - fVar103 * fVar83;
          local_8f8._4_4_ = local_b88._4_4_ * fVar95 - fVar105 * fVar88;
          fStack_8f0 = fVar141 * fStack_ba0 - fVar107 * fStack_bd0;
          fStack_8ec = fVar149 * fStack_b9c - fVar109 * fStack_bcc;
          fVar68 = *(float *)(ray + k * 4);
          fVar99 = *(float *)(ray + k * 4 + 0x10);
          fVar104 = *(float *)(ray + k * 4 + 0x20);
          fVar106 = *(float *)(ray + k * 4 + 0x40);
          fVar124 = *(float *)(ray + k * 4 + 0x50);
          fVar128 = *(float *)(ray + k * 4 + 0x60);
          fVar113 = fVar113 - fVar68;
          fVar115 = fVar115 - fVar68;
          fVar116 = fVar116 - fVar68;
          fVar122 = fVar122 - fVar68;
          fVar130 = fVar130 - fVar99;
          fVar132 = fVar132 - fVar99;
          fVar72 = fVar72 - fVar99;
          fVar82 = fVar82 - fVar99;
          fVar139 = fVar139 - fVar104;
          fVar140 = fVar140 - fVar104;
          fStack_ae0 = fStack_ae0 - fVar104;
          fStack_adc = fStack_adc - fVar104;
          _local_ae8 = CONCAT44(fVar140,fVar139);
          fVar68 = fVar130 * fVar128 - fVar139 * fVar124;
          fVar99 = fVar132 * fVar128 - fVar140 * fVar124;
          fVar104 = fVar72 * fVar128 - fStack_ae0 * fVar124;
          fVar111 = fVar82 * fVar128 - fStack_adc * fVar124;
          fVar129 = fVar139 * fVar106 - fVar113 * fVar128;
          fVar131 = fVar140 * fVar106 - fVar115 * fVar128;
          fVar133 = fStack_ae0 * fVar106 - fVar116 * fVar128;
          fVar134 = fStack_adc * fVar106 - fVar122 * fVar128;
          fVar135 = fVar113 * fVar124 - fVar130 * fVar106;
          fVar136 = fVar115 * fVar124 - fVar132 * fVar106;
          fVar137 = fVar116 * fVar124 - fVar72 * fVar106;
          fVar138 = fVar122 * fVar124 - fVar82 * fVar106;
          fVar161 = fVar106 * (float)local_918._0_4_ +
                    fVar124 * (float)local_908._0_4_ + fVar128 * (float)local_8f8._0_4_;
          fVar118 = fVar106 * (float)local_918._4_4_ +
                    fVar124 * (float)local_908._4_4_ + fVar128 * (float)local_8f8._4_4_;
          fVar120 = fVar106 * fStack_910 + fVar124 * (float)local_908._8_4_ + fVar128 * fStack_8f0;
          fVar125 = fVar106 * fStack_90c + fVar124 * (float)local_908._12_4_ + fVar128 * fStack_8ec;
          uVar73 = (uint)fVar161 & 0x80000000;
          uVar117 = (uint)fVar118 & 0x80000000;
          uVar119 = (uint)fVar120 & 0x80000000;
          uVar121 = (uint)fVar125 & 0x80000000;
          fVar103 = (float)((uint)((float)local_b88 * fVar68 +
                                  fVar103 * fVar129 + local_ad8 * fVar135) ^ uVar73);
          fVar96 = (float)((uint)(local_b88._4_4_ * fVar99 + fVar105 * fVar131 + fVar96 * fVar136) ^
                          uVar117);
          fVar97 = (float)((uint)(fVar141 * fVar104 + fVar107 * fVar133 + fVar97 * fVar137) ^
                          uVar119);
          fVar98 = (float)((uint)(fVar149 * fVar111 + fVar109 * fVar134 + fVar98 * fVar138) ^
                          uVar121);
          fVar68 = (float)((uint)(fVar68 * fVar83 + fVar129 * fVar84 + fVar135 * fVar108) ^ uVar73);
          fVar99 = (float)((uint)(fVar99 * fVar88 + fVar131 * fVar95 + fVar136 * fVar110) ^ uVar117)
          ;
          fVar104 = (float)((uint)(fVar104 * fStack_bd0 + fVar133 * fStack_ba0 + fVar137 * fVar112)
                           ^ uVar119);
          fVar106 = (float)((uint)(fVar111 * fStack_bcc + fVar134 * fStack_b9c + fVar138 * fVar114)
                           ^ uVar121);
          fVar124 = ABS(fVar161);
          fVar128 = ABS(fVar118);
          fVar83 = ABS(fVar120);
          fVar84 = ABS(fVar125);
          bVar35 = ((0.0 <= fVar68 && 0.0 <= fVar103) && fVar161 != 0.0) &&
                   fVar103 + fVar68 <= fVar124;
          auVar127._0_4_ = -(uint)bVar35;
          bVar36 = ((0.0 <= fVar99 && 0.0 <= fVar96) && fVar118 != 0.0) &&
                   fVar96 + fVar99 <= fVar128;
          auVar127._4_4_ = -(uint)bVar36;
          bVar42 = ((0.0 <= fVar104 && 0.0 <= fVar97) && fVar120 != 0.0) &&
                   fVar97 + fVar104 <= fVar83;
          auVar127._8_4_ = -(uint)bVar42;
          bVar67 = ((0.0 <= fVar106 && 0.0 <= fVar98) && fVar125 != 0.0) &&
                   fVar98 + fVar106 <= fVar84;
          auVar127._12_4_ = -(uint)bVar67;
          iVar60 = movmskps(uVar45,auVar127);
          if (iVar60 != 0) {
            fVar88 = (float)(uVar73 ^ (uint)(fVar113 * (float)local_918._0_4_ +
                                            fVar130 * (float)local_908._0_4_ +
                                            fVar139 * (float)local_8f8._0_4_));
            fVar95 = (float)(uVar117 ^
                            (uint)(fVar115 * (float)local_918._4_4_ +
                                  fVar132 * (float)local_908._4_4_ +
                                  fVar140 * (float)local_8f8._4_4_));
            fVar72 = (float)(uVar119 ^
                            (uint)(fVar116 * fStack_910 +
                                  fVar72 * (float)local_908._8_4_ + fStack_ae0 * fStack_8f0));
            fVar82 = (float)(uVar121 ^
                            (uint)(fVar122 * fStack_90c +
                                  fVar82 * (float)local_908._12_4_ + fStack_adc * fStack_8ec));
            fVar130 = *(float *)(ray + k * 4 + 0x30);
            fVar132 = *(float *)(ray + k * 4 + 0x80);
            auVar70._0_4_ =
                 -(uint)((fVar88 <= fVar132 * fVar124 && fVar130 * fVar124 < fVar88) && bVar35);
            auVar70._4_4_ =
                 -(uint)((fVar95 <= fVar132 * fVar128 && fVar130 * fVar128 < fVar95) && bVar36);
            auVar70._8_4_ =
                 -(uint)((fVar72 <= fVar132 * fVar83 && fVar130 * fVar83 < fVar72) && bVar42);
            auVar70._12_4_ =
                 -(uint)((fVar82 <= fVar132 * fVar84 && fVar130 * fVar84 < fVar82) && bVar67);
            uVar73 = movmskps(iVar60,auVar70);
            if (uVar73 != 0) {
              local_8e8 = local_828;
              local_b88 = context->scene;
              auVar38._4_4_ = fVar128;
              auVar38._0_4_ = fVar124;
              auVar38._8_4_ = fVar83;
              auVar38._12_4_ = fVar84;
              auVar75 = rcpps(auVar127,auVar38);
              fVar130 = auVar75._0_4_;
              fVar132 = auVar75._4_4_;
              fVar105 = auVar75._8_4_;
              fVar107 = auVar75._12_4_;
              fVar109 = (float)DAT_01feca10;
              fVar111 = DAT_01feca10._4_4_;
              fVar113 = DAT_01feca10._8_4_;
              fVar115 = DAT_01feca10._12_4_;
              fVar130 = (fVar109 - fVar124 * fVar130) * fVar130 + fVar130;
              fVar132 = (fVar111 - fVar128 * fVar132) * fVar132 + fVar132;
              fVar105 = (fVar113 - fVar83 * fVar105) * fVar105 + fVar105;
              fVar107 = (fVar115 - fVar84 * fVar107) * fVar107 + fVar107;
              local_928._0_4_ = fVar88 * fVar130;
              local_928._4_4_ = fVar95 * fVar132;
              fStack_920 = fVar72 * fVar105;
              fStack_91c = fVar82 * fVar107;
              auVar165._0_4_ = fVar103 * fVar130;
              auVar165._4_4_ = fVar96 * fVar132;
              auVar165._8_4_ = fVar97 * fVar105;
              auVar165._12_4_ = fVar98 * fVar107;
              auVar90 = minps(auVar165,_DAT_01feca10);
              auVar102._0_4_ = fVar130 * fVar68;
              auVar102._4_4_ = fVar132 * fVar99;
              auVar102._8_4_ = fVar105 * fVar104;
              auVar102._12_4_ = fVar107 * fVar106;
              auVar75 = minps(auVar102,_DAT_01feca10);
              auVar37._4_4_ = fVar111 - auVar90._4_4_;
              auVar37._0_4_ = fVar109 - auVar90._0_4_;
              auVar37._8_4_ = fVar113 - auVar90._8_4_;
              auVar37._12_4_ = fVar115 - auVar90._12_4_;
              local_948 = blendvps(auVar90,auVar37,local_828);
              auVar39._4_4_ = fVar111 - auVar75._4_4_;
              auVar39._0_4_ = fVar109 - auVar75._0_4_;
              auVar39._8_4_ = fVar113 - auVar75._8_4_;
              auVar39._12_4_ = fVar115 - auVar75._12_4_;
              local_938 = blendvps(auVar75,auVar39,local_828);
              uVar57 = (ulong)(uVar73 & 0xff);
              fVar68 = local_b08;
              fVar130 = fStack_b04;
              fVar132 = fStack_b00;
              fVar72 = fStack_afc;
              fVar99 = local_b18;
              fVar82 = fStack_b14;
              fVar83 = fStack_b10;
              fVar84 = fStack_b0c;
              fVar104 = local_b28;
              fVar88 = fStack_b24;
              fVar95 = fStack_b20;
              fVar96 = fStack_b1c;
              fVar124 = local_b48;
              fVar97 = fStack_b44;
              fVar98 = fStack_b40;
              fVar103 = fStack_b3c;
              fVar128 = local_b58;
              fVar105 = fStack_b54;
              fVar107 = fStack_b50;
              fVar109 = fStack_b4c;
              iVar60 = local_b68;
              iVar144 = iStack_b64;
              iVar146 = iStack_b60;
              iVar148 = iStack_b5c;
              iVar150 = local_b78;
              iVar152 = iStack_b74;
              iVar154 = iStack_b70;
              iVar156 = iStack_b6c;
              fVar106 = local_b38;
              fVar111 = fStack_b34;
              fVar113 = fStack_b30;
              fVar115 = fStack_b2c;
              do {
                uVar59 = 0;
                if (uVar57 != 0) {
                  for (; (uVar57 >> uVar59 & 1) == 0; uVar59 = uVar59 + 1) {
                  }
                }
                local_878 = *(uint *)(lVar28 + 0x40 + uVar59 * 4);
                pGVar26 = (local_b88->geometries).items[local_878].ptr;
                if ((pGVar26->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                  uVar57 = uVar57 ^ 1L << (uVar59 & 0x3f);
                  bVar67 = true;
                }
                else if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                        (pGVar26->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                  bVar67 = false;
                }
                else {
                  local_ad8 = *(float *)(ray + k * 4 + 0x80);
                  local_8a8 = *(undefined4 *)(local_948 + uVar59 * 4);
                  uVar53 = *(undefined4 *)(local_938 + uVar59 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_928 + uVar59 * 4);
                  args.context = context->user;
                  uVar24 = *(undefined4 *)(lVar28 + 0x50 + uVar59 * 4);
                  local_888._4_4_ = uVar24;
                  local_888._0_4_ = uVar24;
                  local_888._8_4_ = uVar24;
                  local_888._12_4_ = uVar24;
                  local_898._4_4_ = uVar53;
                  local_898._0_4_ = uVar53;
                  local_898._8_4_ = uVar53;
                  local_898._12_4_ = uVar53;
                  uVar53 = *(undefined4 *)(local_918 + uVar59 * 4);
                  local_8c8 = *(undefined4 *)(local_908 + uVar59 * 4);
                  local_8b8 = *(undefined4 *)(local_8f8 + uVar59 * 4);
                  local_8d8[0] = (RTCHitN)(char)uVar53;
                  local_8d8[1] = (RTCHitN)(char)((uint)uVar53 >> 8);
                  local_8d8[2] = (RTCHitN)(char)((uint)uVar53 >> 0x10);
                  local_8d8[3] = (RTCHitN)(char)((uint)uVar53 >> 0x18);
                  local_8d8[4] = (RTCHitN)(char)uVar53;
                  local_8d8[5] = (RTCHitN)(char)((uint)uVar53 >> 8);
                  local_8d8[6] = (RTCHitN)(char)((uint)uVar53 >> 0x10);
                  local_8d8[7] = (RTCHitN)(char)((uint)uVar53 >> 0x18);
                  local_8d8[8] = (RTCHitN)(char)uVar53;
                  local_8d8[9] = (RTCHitN)(char)((uint)uVar53 >> 8);
                  local_8d8[10] = (RTCHitN)(char)((uint)uVar53 >> 0x10);
                  local_8d8[0xb] = (RTCHitN)(char)((uint)uVar53 >> 0x18);
                  local_8d8[0xc] = (RTCHitN)(char)uVar53;
                  local_8d8[0xd] = (RTCHitN)(char)((uint)uVar53 >> 8);
                  local_8d8[0xe] = (RTCHitN)(char)((uint)uVar53 >> 0x10);
                  local_8d8[0xf] = (RTCHitN)(char)((uint)uVar53 >> 0x18);
                  uStack_8c4 = local_8c8;
                  uStack_8c0 = local_8c8;
                  uStack_8bc = local_8c8;
                  uStack_8b4 = local_8b8;
                  uStack_8b0 = local_8b8;
                  uStack_8ac = local_8b8;
                  uStack_8a4 = local_8a8;
                  uStack_8a0 = local_8a8;
                  uStack_89c = local_8a8;
                  uStack_874 = local_878;
                  uStack_870 = local_878;
                  uStack_86c = local_878;
                  local_868 = (args.context)->instID[0];
                  uStack_864 = local_868;
                  uStack_860 = local_868;
                  uStack_85c = local_868;
                  local_858 = (args.context)->instPrimID[0];
                  uStack_854 = local_858;
                  uStack_850 = local_858;
                  uStack_84c = local_858;
                  local_b98 = *local_ac0;
                  args.valid = (int *)local_b98;
                  args.geometryUserPtr = pGVar26->userPtr;
                  args.hit = local_8d8;
                  args.N = 4;
                  pRVar49 = (RTCRayN *)pGVar26->occlusionFilterN;
                  args.ray = (RTCRayN *)ray;
                  if (pRVar49 != (RTCRayN *)0x0) {
                    pRVar49 = (RTCRayN *)(*(code *)pRVar49)(&args);
                  }
                  if (local_b98 == (undefined1  [16])0x0) {
                    auVar80._8_4_ = 0xffffffff;
                    auVar80._0_8_ = 0xffffffffffffffff;
                    auVar80._12_4_ = 0xffffffff;
                    auVar80 = auVar80 ^ _DAT_01febe20;
                  }
                  else {
                    p_Var34 = context->args->filter;
                    if ((p_Var34 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar26->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var34)(&args);
                    }
                    auVar71._0_4_ = -(uint)(local_b98._0_4_ == 0);
                    auVar71._4_4_ = -(uint)(local_b98._4_4_ == 0);
                    auVar71._8_4_ = -(uint)(local_b98._8_4_ == 0);
                    auVar71._12_4_ = -(uint)(local_b98._12_4_ == 0);
                    auVar80 = auVar71 ^ _DAT_01febe20;
                    auVar75 = blendvps(_DAT_01feba00,*(undefined1 (*) [16])(args.ray + 0x80),auVar71
                                      );
                    *(undefined1 (*) [16])(args.ray + 0x80) = auVar75;
                    pRVar49 = args.ray;
                  }
                  auVar81._0_4_ = auVar80._0_4_ << 0x1f;
                  auVar81._4_4_ = auVar80._4_4_ << 0x1f;
                  auVar81._8_4_ = auVar80._8_4_ << 0x1f;
                  auVar81._12_4_ = auVar80._12_4_ << 0x1f;
                  iVar60 = movmskps((int)pRVar49,auVar81);
                  bVar67 = iVar60 == 0;
                  fVar68 = local_b08;
                  fVar130 = fStack_b04;
                  fVar132 = fStack_b00;
                  fVar72 = fStack_afc;
                  fVar99 = local_b18;
                  fVar82 = fStack_b14;
                  fVar83 = fStack_b10;
                  fVar84 = fStack_b0c;
                  fVar104 = local_b28;
                  fVar88 = fStack_b24;
                  fVar95 = fStack_b20;
                  fVar96 = fStack_b1c;
                  fVar124 = local_b48;
                  fVar97 = fStack_b44;
                  fVar98 = fStack_b40;
                  fVar103 = fStack_b3c;
                  fVar128 = local_b58;
                  fVar105 = fStack_b54;
                  fVar107 = fStack_b50;
                  fVar109 = fStack_b4c;
                  iVar60 = local_b68;
                  iVar144 = iStack_b64;
                  iVar146 = iStack_b60;
                  iVar148 = iStack_b5c;
                  iVar150 = local_b78;
                  iVar152 = iStack_b74;
                  iVar154 = iStack_b70;
                  iVar156 = iStack_b6c;
                  fVar106 = local_b38;
                  fVar111 = fStack_b34;
                  fVar113 = fStack_b30;
                  fVar115 = fStack_b2c;
                  if (bVar67) {
                    *(float *)(ray + k * 4 + 0x80) = local_ad8;
                    uVar57 = uVar57 ^ 1L << (uVar59 & 0x3f);
                  }
                }
                if (!bVar67) goto LAB_0029921f;
              } while (uVar57 != 0);
            }
          }
          uVar51 = uVar51 + 1;
          bVar66 = uVar51 < uVar50;
        } while (uVar51 != uVar50);
        uVar73 = 0;
        uVar51 = local_aa8;
        uVar56 = local_a90;
        uVar57 = local_a98;
        uVar59 = local_aa0;
        uVar61 = local_ab0;
        uVar63 = local_ab8;
        fVar68 = local_b08;
        fVar130 = fStack_b04;
        fVar132 = fStack_b00;
        fVar72 = fStack_afc;
        fVar99 = local_b18;
        fVar82 = fStack_b14;
        fVar83 = fStack_b10;
        fVar84 = fStack_b0c;
        fVar104 = local_b28;
        fVar88 = fStack_b24;
        fVar95 = fStack_b20;
        fVar96 = fStack_b1c;
        fVar124 = local_b48;
        fVar97 = fStack_b44;
        fVar98 = fStack_b40;
        fVar103 = fStack_b3c;
        fVar128 = local_b58;
        fVar105 = fStack_b54;
        fVar107 = fStack_b50;
        fVar109 = fStack_b4c;
        iVar60 = local_b68;
        iVar144 = iStack_b64;
        iVar146 = iStack_b60;
        iVar148 = iStack_b5c;
        iVar150 = local_b78;
        iVar152 = iStack_b74;
        iVar154 = iStack_b70;
        iVar156 = iStack_b6c;
        fVar106 = local_b38;
        fVar111 = fStack_b34;
        fVar113 = fStack_b30;
        fVar115 = fStack_b2c;
      }
    }
    goto LAB_00299215;
  }
  goto LAB_00299271;
LAB_0029921f:
  uVar73 = 0;
  uVar51 = local_aa8;
  uVar56 = local_a90;
  uVar57 = local_a98;
  uVar59 = local_aa0;
  uVar61 = local_ab0;
  uVar63 = local_ab8;
  if (bVar66) {
    *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
    uVar73 = 1;
  }
LAB_00299215:
  if ((uVar73 & 3) != 0) {
LAB_00299271:
    return pNVar54 != stack;
  }
  goto LAB_00297db8;
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }